

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_insert(jit_State *J,RecordFFData *rd)

{
  ulong uVar1;
  TRef TVar2;
  TRef TVar3;
  MSize MVar4;
  GCtab *t;
  TValue TStack_f8;
  TRef trlen;
  RecordIndex ix;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  ix.oldv._0_4_ = *J->base;
  ix.tab = J->base[1];
  rd->nres = 0;
  if ((((uint)ix.oldv & 0x1f000000) == 0xb000000) && (ix.tab != 0)) {
    ix._64_8_ = rd;
    if (J->base[2] == 0) {
      (J->fold).ins.field_0.ot = 0x4913;
      (J->fold).ins.field_0.op1 = (IRRef1)(uint)ix.oldv;
      (J->fold).ins.field_0.op2 = 0x7fff;
      TVar2 = lj_opt_fold(J);
      uVar1 = **(ulong **)ix._64_8_;
      TVar3 = lj_ir_kint(J,1);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      ix.oldv._4_4_ = lj_opt_fold(J);
      TStack_f8.u64 = uVar1 & 0x7fffffffffff | 0xfffa000000000000;
      MVar4 = lj_tab_len((GCtab *)(uVar1 & 0x7fffffffffff));
      ix.tabv.n = (lua_Number)(int)(MVar4 + 1);
      ix.mt = 0;
      lj_record_idx(J,(RecordIndex *)&stack0xffffffffffffff08);
    }
    else {
      recff_nyi(J,rd);
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_insert(jit_State *J, RecordFFData *rd)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  ix.val = J->base[1];
  rd->nres = 0;
  if (tref_istab(ix.tab) && ix.val) {
    if (!J->base[2]) {  /* Simple push: t[#t+1] = v */
      TRef trlen = emitir(IRTI(IR_ALEN), ix.tab, TREF_NIL);
      GCtab *t = tabV(&rd->argv[0]);
      ix.key = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
      settabV(J->L, &ix.tabv, t);
      setintV(&ix.keyv, lj_tab_len(t) + 1);
      ix.idxchain = 0;
      lj_record_idx(J, &ix);  /* Set new value. */
    } else {  /* Complex case: insert in the middle. */
      recff_nyiu(J, rd);
      return;
    }
  }  /* else: Interpreter will throw. */
}